

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<29UL> * mserialize::cx_strcat<29ul>(cx_string<29UL> *strings)

{
  cx_string<29UL> *in_RSI;
  cx_string<29UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [2];
  char *data [2];
  char buffer [30];
  char *in_stack_ffffffffffffffa0;
  ulong local_58;
  char *local_50;
  ulong local_48;
  size_t local_40;
  char *local_38;
  data_ref local_30;
  char local_28 [32];
  cx_string<29UL> *local_8;
  
  local_8 = in_RSI;
  memset(local_28,0,0x1e);
  local_38 = "";
  local_30 = cx_string<29UL>::data(local_8);
  local_48 = 0;
  local_40 = cx_string<29UL>::size(local_8);
  local_50 = local_28;
  for (local_58 = 1; local_58 < 2; local_58 = local_58 + 1) {
    for (in_stack_ffffffffffffffa0 = (char *)0x0;
        in_stack_ffffffffffffffa0 < (cx_string<29UL> *)(&local_48)[local_58];
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
      *local_50 = in_stack_ffffffffffffffa0[(long)(&local_38)[local_58]];
      local_50 = local_50 + 1;
    }
  }
  cx_string<29UL>::cx_string((cx_string<29UL> *)in_stack_ffffffffffffffa0,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}